

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.hpp
# Opt level: O2

void __thiscall
diy::RegularMergePartners::outgoing
          (RegularMergePartners *this,int round,int gid,vector<int,_std::allocator<int>_> *partners,
          Master *param_4)

{
  vector<int,_std::allocator<int>_> tmp;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (value_type_conflict *)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RegularPartners::fill
            (&this->super_RegularPartners,round,gid,(vector<int,_std::allocator<int>_> *)&local_28);
  Catch::clara::std::vector<int,_std::allocator<int>_>::push_back
            (partners,local_28._M_impl.super__Vector_impl_data._M_start);
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

inline void   outgoing(int round, int gid, std::vector<int>& partners, const Master&) const    { std::vector<int> tmp; Parent::fill(round, gid, tmp); partners.push_back(tmp[0]); }